

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O3

void ImGuizmo::DecomposeMatrixToComponents
               (float *matrix,float *translation,float *rotation,float *scale)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  float fVar5;
  undefined1 auVar6 [16];
  matrix_t mat;
  anon_union_64_4_9b27bf75_for_matrix_t_0 local_58;
  
  auVar4 = *(undefined1 (*) [12])matrix;
  uVar1 = *(undefined8 *)(matrix + 4);
  local_58._24_8_ = *(undefined8 *)(matrix + 6);
  uVar2 = *(undefined8 *)(matrix + 8);
  local_58._40_8_ = *(undefined8 *)(matrix + 10);
  local_58._48_8_ = *(undefined8 *)(matrix + 0xc);
  local_58._56_8_ = *(undefined8 *)(matrix + 0xe);
  local_58.m[0][0] = (float)*(undefined8 *)matrix;
  local_58.m[0][1] = (float)((ulong)*(undefined8 *)matrix >> 0x20);
  local_58.m[0][2] = (float)*(undefined8 *)(matrix + 2);
  local_58.m[0][3] = (float)((ulong)*(undefined8 *)(matrix + 2) >> 0x20);
  auVar3._12_4_ = local_58.m[0][3];
  auVar3._0_12_ = auVar4;
  local_58.m[1][0] = (float)uVar1;
  local_58.m[1][1] = (float)((ulong)uVar1 >> 0x20);
  auVar6._4_4_ = local_58.m[1][2] * local_58.m[1][2] +
                 local_58.m[1][0] * local_58.m[1][0] + local_58.m[1][1] * local_58.m[1][1];
  auVar6._0_4_ = local_58.m[0][2] * local_58.m[0][2] +
                 auVar4._0_4_ * auVar4._0_4_ + local_58.m[0][1] * local_58.m[0][1];
  auVar6._8_4_ = local_58.m[1][0] * local_58.m[1][0] +
                 auVar4._8_4_ * auVar4._8_4_ + local_58.m[0][3] * local_58.m[0][3];
  auVar6._12_4_ =
       local_58.m[1][1] * local_58.m[1][1] +
       local_58.m[0][3] * local_58.m[0][3] + local_58.m[1][0] * local_58.m[1][0];
  auVar6 = sqrtps(auVar3,auVar6);
  *(long *)scale = auVar6._0_8_;
  local_58.m[2][0] = (float)uVar2;
  local_58.m[2][1] = (float)((ulong)uVar2 >> 0x20);
  scale[2] = SQRT(local_58.m[2][2] * local_58.m[2][2] +
                  local_58.m[2][0] * local_58.m[2][0] + local_58.m[2][1] * local_58.m[2][1]);
  local_58._16_8_ = uVar1;
  local_58._32_8_ = uVar2;
  matrix_t::OrthoNormalize((matrix_t *)&local_58.v);
  fVar5 = atan2f(local_58.m[1][2],local_58.m[2][2]);
  *rotation = fVar5 * 57.295776;
  fVar5 = atan2f(-local_58.m[0][2],
                 SQRT(local_58.m[1][2] * local_58.m[1][2] + local_58.m[2][2] * local_58.m[2][2]));
  rotation[1] = fVar5 * 57.295776;
  fVar5 = atan2f(local_58.m[0][1],local_58.m[0][0]);
  rotation[2] = fVar5 * 57.295776;
  *(undefined8 *)translation = local_58._48_8_;
  translation[2] = local_58.m[3][2];
  return;
}

Assistant:

void DecomposeMatrixToComponents(const float *matrix, float *translation, float *rotation, float *scale)
   {
      matrix_t mat = *(matrix_t*)matrix;

      scale[0] = mat.v.right.Length();
      scale[1] = mat.v.up.Length();
      scale[2] = mat.v.dir.Length(); 

      mat.OrthoNormalize();

      rotation[0] = RAD2DEG * atan2f(mat.m[1][2], mat.m[2][2]);
      rotation[1] = RAD2DEG * atan2f(-mat.m[0][2], sqrtf(mat.m[1][2] * mat.m[1][2] + mat.m[2][2]* mat.m[2][2]));
      rotation[2] = RAD2DEG * atan2f(mat.m[0][1], mat.m[0][0]);

      translation[0] = mat.v.position.x;
      translation[1] = mat.v.position.y;
      translation[2] = mat.v.position.z;
   }